

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

TGAColor __thiscall Model::diffuse(Model *this,vec2f *uvf)

{
  TGAColor TVar1;
  TGAImage *this_00;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  vec2f *uvf_local;
  Model *this_local;
  
  this_00 = &this->diffusemap_;
  dVar5 = vec<2UL,_double>::operator[](uvf,0);
  sVar2 = TGAImage::get_width(this_00);
  auVar7._8_4_ = (int)(sVar2 >> 0x20);
  auVar7._0_8_ = sVar2;
  auVar7._12_4_ = 0x45300000;
  dVar5 = dVar5 * ((auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
  uVar3 = (ulong)dVar5;
  dVar6 = vec<2UL,_double>::operator[](uvf,1);
  sVar2 = TGAImage::get_height(this_00);
  auVar8._8_4_ = (int)(sVar2 >> 0x20);
  auVar8._0_8_ = sVar2;
  auVar8._12_4_ = 0x45300000;
  dVar6 = dVar6 * ((auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
  uVar4 = (ulong)dVar6;
  TVar1 = TGAImage::get(this_00,uVar3 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f,
                        uVar4 | (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f);
  return TVar1;
}

Assistant:

TGAColor Model::diffuse(const vec2f &uvf) const
{
    return diffusemap_.get(static_cast<size_t>(uvf[0] * diffusemap_.get_width()),
                           static_cast<size_t>(uvf[1] * diffusemap_.get_height()));
}